

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubD::DeleteComponentsForExperts
          (ON_SubD *this,ON_SubDComponentPtr *cptr_list,size_t cptr_count,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  ON_SubDimple *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ON_ComponentStatus OVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  size_t sVar4;
  ulong uVar5;
  ushort uVar6;
  int iVar7;
  ulong uVar8;
  undefined7 in_register_00000081;
  long lVar9;
  ulong uVar10;
  undefined7 in_register_00000089;
  ulong *puVar11;
  uint max_level_index;
  uint uVar12;
  uint uVar13;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentIterator cit;
  ON_ComponentStatus local_ae;
  uint local_ac;
  uint local_a8;
  undefined4 local_a4;
  ON_SubDComponentPtr local_a0;
  undefined4 local_94;
  ON_SubDimple *local_90;
  ON_SubDLevel *local_88;
  ON_SubDComponentIterator local_80;
  
  if ((int)CONCAT71(in_register_00000089,bMarkDeletedFaceEdges) != 0) {
    ClearComponentMarks(this,false,true,false,(ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0);
  }
  if (cptr_count == 0) {
    return true;
  }
  if (((cptr_list == (ON_SubDComponentPtr *)0x0) ||
      (pOVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr, pOVar1 == (ON_SubDimple *)0x0)) ||
     (uVar13 = (pOVar1->m_levels).m_count, uVar13 == 0)) {
LAB_005e1bd6:
    ON_SubDIncrementErrorCount();
    return false;
  }
  local_a4 = (undefined4)CONCAT71(in_register_00000009,bDeleteIsolatedEdges);
  sVar4 = 0;
  max_level_index = uVar13;
  do {
    uVar5 = cptr_list[sVar4].m_ptr & 0xfffffffffffffff8;
    if ((uVar5 != 0 && (cptr_list[sVar4].m_ptr & 6) != 0) &&
       (uVar12 = (uint)*(byte *)(uVar5 + 0x13), uVar12 <= max_level_index)) {
      max_level_index = uVar12;
    }
    sVar4 = sVar4 + 1;
  } while (cptr_count != sVar4);
  if ((max_level_index == uVar13) || (uVar13 <= max_level_index)) goto LAB_005e1bd6;
  pOVar1->m_active_level = (pOVar1->m_levels).m_a[max_level_index];
  local_90 = pOVar1;
  ON_SubDimple::ClearHigherSubdivisionLevels(pOVar1,max_level_index);
  local_88 = local_90->m_active_level;
  if ((local_88 == (ON_SubDLevel *)0x0) || (local_88->m_level_index != max_level_index))
  goto LAB_005e1bd6;
  local_94 = (undefined4)CONCAT71(in_register_00000081,bUpdateTagsAndCoefficients);
  ON_SubDComponentIterator::ON_SubDComponentIterator(&local_80,this);
  local_a0 = ON_SubDComponentIterator::FirstComponent(&local_80);
  while ((OVar2 = ON_ComponentStatus::AllSet, 7 < local_a0.m_ptr && ((local_a0.m_ptr & 6) != 0))) {
    local_ae = ON_SubDComponentPtr::Status(&local_a0);
    bVar3 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_ae);
    if (bVar3) {
      ON_SubDComponentPtr::ClearStates(&local_a0,ON_ComponentStatus::Damaged);
    }
    local_a0 = ON_SubDComponentIterator::NextComponent(&local_80);
  }
  sVar4 = 0;
  do {
    uVar8 = cptr_list[sVar4].m_ptr & 6;
    uVar5 = cptr_list[sVar4].m_ptr & 0xfffffffffffffff8;
    if ((uVar5 != 0 && uVar8 != 0) && (max_level_index == *(byte *)(uVar5 + 0x13))) {
      *(ON_ComponentStatus *)(uVar5 + 0x10) = OVar2;
      iVar7 = (int)uVar8;
      if (iVar7 == 2) {
        uVar6 = *(ushort *)(uVar5 + 0x68);
        if (uVar6 != 0) {
          uVar8 = 0;
          do {
            uVar10 = *(ulong *)(*(long *)(uVar5 + 0x70) + uVar8 * 8) & 0xfffffffffffffff8;
            if (uVar10 != 0) {
              *(ON_ComponentStatus *)(uVar10 + 0x10) = OVar2;
              uVar6 = *(ushort *)(uVar5 + 0x68);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar6);
        }
        uVar6 = *(ushort *)(uVar5 + 0x6a);
        if (uVar6 != 0) {
          uVar8 = 0;
          do {
            lVar9 = *(long *)(*(long *)(uVar5 + 0x78) + uVar8 * 8);
            if (lVar9 != 0) {
              *(ON_ComponentStatus *)(lVar9 + 0x10) = OVar2;
              uVar6 = *(ushort *)(uVar5 + 0x6a);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar6);
        }
      }
      else if ((iVar7 == 4) && (uVar6 = *(ushort *)(uVar5 + 100), uVar6 != 0)) {
        lVar9 = -0x10;
        uVar8 = 0;
        do {
          if (uVar8 < 2) {
            puVar11 = (ulong *)(uVar5 + 0x68 + uVar8 * 8);
          }
          else {
            puVar11 = (ulong *)(*(long *)(uVar5 + 0x78) + lVar9);
          }
          if ((*puVar11 & 0xfffffffffffffff8) != 0) {
            *(ON_ComponentStatus *)((*puVar11 & 0xfffffffffffffff8) + 0x10) = OVar2;
            uVar6 = *(ushort *)(uVar5 + 100);
          }
          uVar8 = uVar8 + 1;
          lVar9 = lVar9 + 8;
        } while (uVar8 < uVar6);
      }
    }
    sVar4 = sVar4 + 1;
  } while (sVar4 != cptr_count);
  local_a0 = ON_SubDComponentIterator::FirstComponent(&local_80);
  local_a8 = 0;
  uVar13 = 0;
  local_ac = 0;
  while ((pOVar1 = local_90, 7 < local_a0.m_ptr &&
         (uVar12 = (uint)local_a0.m_ptr & 6, (local_a0.m_ptr & 6) != 0))) {
    local_ae = ON_SubDComponentPtr::Status(&local_a0);
    bVar3 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_ae);
    if (bVar3) {
      if (uVar12 == 2) {
        local_a8 = local_a8 + 1;
      }
      else if (uVar12 == 4) {
        uVar13 = uVar13 + 1;
      }
      else {
        local_ac = local_ac + 1;
      }
    }
    local_a0 = ON_SubDComponentIterator::NextComponent(&local_80);
  }
  if ((local_a8 == 0 && uVar13 == 0) && local_ac == 0) {
LAB_005e1d91:
    bVar3 = false;
  }
  else {
    if (((local_a8 < local_88->m_vertex_count) && (uVar13 < local_88->m_edge_count)) &&
       (SUB41(local_a4,0) != true || local_ac < local_88->m_face_count)) {
      uVar13 = ON_SubDimple::DeleteComponents
                         (local_90,max_level_index,SUB41(local_a4,0),local_94._0_1_,
                          bMarkDeletedFaceEdges);
      if ((pOVar1->m_levels).m_count != 0) {
        bVar3 = uVar13 != 0;
        if (uVar13 != 0 || max_level_index != 0) {
          ON_SubDimple::ClearLowerSubdivisionLevels(pOVar1,max_level_index);
          goto LAB_005e1e0c;
        }
        goto LAB_005e1d91;
      }
    }
    this_00 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    bVar3 = true;
  }
LAB_005e1e0c:
  ON_SubDRef::~ON_SubDRef(&local_80.m_subd_ref);
  return bVar3;
}

Assistant:

bool ON_SubD::DeleteComponentsForExperts(
  const ON_SubDComponentPtr* cptr_list,
  size_t cptr_count,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
)
{
  if (bMarkDeletedFaceEdges)
    ClearComponentMarks(false,true,false,nullptr);

  if ( cptr_count <= 0 )
    return true;

  if ( nullptr == cptr_list )
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDimple* subdimple = SubDimple(false);
  if ( nullptr == subdimple )
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned int level_count = subdimple->LevelCount();
  if (level_count <= 0)
    return ON_SUBD_RETURN_ERROR(false);
  
  unsigned level_index = level_count;
  for (size_t i = 0; i < cptr_count; i++)
  {
    const ON_SubDComponentBase* c = cptr_list[i].ComponentBase();
    if ( nullptr == c)
      continue;
    if ( c->SubdivisionLevel() < level_index )
      level_index = c->SubdivisionLevel();
  }
  if ( level_index == level_count )
    return ON_SUBD_RETURN_ERROR(false);

  if ( false == subdimple->SetActiveLevel(level_index) )
    return ON_SUBD_RETURN_ERROR(false);

  subdimple->ClearHigherSubdivisionLevels(level_index);
  const ON_SubDLevel* level = subdimple->ActiveLevelPointer();
  if ( nullptr == level || level->m_level_index != level_index)
    return ON_SUBD_RETURN_ERROR(false);

  // Make sure no components have a status = ON_ComponentStatus::AllSet
  // because this uncommon status value is used to mark components that will be be deleted.
  ON_SubDComponentIterator cit(*this);
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if ( ON_ComponentStatus::AllSet == cptr.Status() )
      cptr.ClearStates(ON_ComponentStatus::Damaged);
  }

  // Set the status of every component in cptr_list[] to ON_ComponentStatus::AllSet.
  // If that component is a vertex, set the status of every edge and face that
  // touch the vertex to ON_ComponentStatus::AllSet.
  // If that component is an edge, set the status of every face that
  // touches the edge to ON_ComponentStatus::AllSet.
  for (size_t i = 0; i < cptr_count; i++)
  {
    ON_SubDComponentPtr cptr = cptr_list[i];
    const ON_SubDComponentBase* c = cptr.ComponentBase();
    if (nullptr == c)
      continue;
    if (c->SubdivisionLevel() != level_index)
      continue;
    c->m_status = ON_ComponentStatus::AllSet;
    switch (cptr.ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      {
        const ON_SubDVertex* vertex = cptr.Vertex();
        if (nullptr == vertex)
          continue;
        for (unsigned short vei = 0; vei < vertex->m_edge_count; vei++)
        {
          const ON_SubDEdge* edge = vertex->Edge(vei);
          if (nullptr == edge)
            continue;
          edge->m_status = ON_ComponentStatus::AllSet;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; vfi++)
        {
          const ON_SubDFace* face = vertex->Face(vfi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Edge:
      {
        const ON_SubDEdge* edge = cptr.Edge();
        if (nullptr == edge)
          continue;
        edge->m_status = ON_ComponentStatus::AllSet;
        for (unsigned short efi = 0; efi < edge->m_face_count; efi++)
        {
          const ON_SubDFace* face = edge->Face(efi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Face:
      {
        const ON_SubDFace* face = cptr.Face();
        if (nullptr == face)
          continue;
        face->m_status = ON_ComponentStatus::AllSet;
      }
      break;
            
    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }

  // Minimum count of what will be deleted. (
  unsigned int deleted_vertex_count = 0;
  unsigned int deleted_edge_count = 0;
  unsigned int deleted_face_count = 0;
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if (ON_ComponentStatus::AllSet == cptr.Status())
    {
      switch (cptr.ComponentType())
      {
      case ON_SubDComponentPtr::Type::Vertex:
        deleted_vertex_count++;
        break;

      case ON_SubDComponentPtr::Type::Edge:
        deleted_edge_count++;
        break;

      case ON_SubDComponentPtr::Type::Face:
        deleted_face_count++;
        break;
      case ON_SubDComponentPtr::Type::Unset:
        break;
      }
      continue;
    }
  }

  if ( 0 == deleted_vertex_count && 0 == deleted_edge_count && 0 ==  deleted_face_count )
    return false;

  const bool bDestroy
    = deleted_vertex_count >= level->m_vertex_count
    || deleted_edge_count >= level->m_edge_count
    || (deleted_face_count >= level->m_face_count && bDeleteIsolatedEdges)
    ;
  if (bDestroy)
  {
    Destroy();
    return true;
  }

  unsigned int deleted_component_count = subdimple->DeleteComponents(level_index,bDeleteIsolatedEdges,bUpdateTagsAndCoefficients,bMarkDeletedFaceEdges);

  if (0 == subdimple->LevelCount())
  {
    Destroy();
    return true;
  }

  if (deleted_component_count > 0 || level_index > 0)
  {
    // remove lower levels
    subdimple->ClearLowerSubdivisionLevels(level_index);
  }

  return (deleted_component_count > 0);
}